

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetupViewportDrawData(ImGuiViewportP *viewport,ImVector<ImDrawList_*> *draw_lists)

{
  ImGuiIO *pIVar1;
  int *in_RSI;
  long in_RDI;
  int n;
  ImDrawData *draw_data;
  ImGuiIO *io;
  undefined8 local_30;
  int local_24;
  
  pIVar1 = ImGui::GetIO();
  *(undefined1 *)(in_RDI + 0x40) = 1;
  if (*in_RSI < 1) {
    local_30 = 0;
  }
  else {
    local_30 = *(undefined8 *)(in_RSI + 2);
  }
  *(undefined8 *)(in_RDI + 0x50) = local_30;
  *(int *)(in_RDI + 0x44) = *in_RSI;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(in_RDI + 4);
  *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(in_RDI + 0xc);
  *(ImVec2 *)(in_RDI + 0x68) = pIVar1->DisplayFramebufferScale;
  for (local_24 = 0; local_24 < *in_RSI; local_24 = local_24 + 1) {
    *(int *)(in_RDI + 0x4c) =
         *(int *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_24 * 8) + 0x20) +
         *(int *)(in_RDI + 0x4c);
    *(int *)(in_RDI + 0x48) =
         *(int *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_24 * 8) + 0x10) +
         *(int *)(in_RDI + 0x48);
  }
  return;
}

Assistant:

static void SetupViewportDrawData(ImGuiViewportP* viewport, ImVector<ImDrawList*>* draw_lists)
{
    ImGuiIO& io = ImGui::GetIO();
    ImDrawData* draw_data = &viewport->DrawDataP;
    draw_data->Valid = true;
    draw_data->CmdLists = (draw_lists->Size > 0) ? draw_lists->Data : NULL;
    draw_data->CmdListsCount = draw_lists->Size;
    draw_data->TotalVtxCount = draw_data->TotalIdxCount = 0;
    draw_data->DisplayPos = viewport->Pos;
    draw_data->DisplaySize = viewport->Size;
    draw_data->FramebufferScale = io.DisplayFramebufferScale;
    for (int n = 0; n < draw_lists->Size; n++)
    {
        draw_data->TotalVtxCount += draw_lists->Data[n]->VtxBuffer.Size;
        draw_data->TotalIdxCount += draw_lists->Data[n]->IdxBuffer.Size;
    }
}